

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

void recff_cdata_arith(jit_State *J,RecordFFData *rd)

{
  CTState *cts;
  CType *pCVar1;
  CTState *cts_00;
  TValue *pTVar2;
  uint64_t uVar3;
  ushort uVar4;
  IRRef1 IVar5;
  IRType IVar6;
  CTInfo CVar7;
  TRef TVar8;
  TRef TVar9;
  TRef TVar10;
  CTSize CVar11;
  CTypeID k;
  GCcdata *pGVar12;
  ulong uVar13;
  CType *pCVar14;
  cTValue *tv;
  TRef *pTVar15;
  ushort uVar16;
  ushort uVar17;
  IROpT IVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  GCobj *o;
  ulong uVar23;
  int32_t iVar24;
  IRRef1 IVar25;
  TRef tr;
  long lVar26;
  TRef sp [2];
  CType *s [2];
  CTSize ofs;
  
  cts = *(CTState **)&J[-1].penalty[0x3c].val;
  for (lVar26 = 0; pCVar14 = s[0], lVar26 != 2; lVar26 = lVar26 + 1) {
    uVar22 = J->base[lVar26];
    if (uVar22 == 0) goto LAB_00133d74;
    uVar19 = uVar22 & 0x1f000000;
    if (uVar19 == 0) {
      uVar22 = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
LAB_00133382:
      pCVar14 = cts->tab + 0x11;
    }
    else {
      IVar25 = (IRRef1)uVar22;
      if (uVar19 == 0xa000000) {
        pGVar12 = argv2cdata(J,uVar22,rd->argv + lVar26);
        uVar17 = pGVar12->ctypeid;
        uVar22 = cts->tab[uVar17].info;
        pCVar14 = cts->tab + uVar17;
        IVar6 = crec_ct2irt(cts,pCVar14);
        uVar22 = uVar22 >> 0x1c;
        uVar16 = (ushort)IVar6;
        if (uVar22 == 2) {
          (J->fold).ins.field_0.ot = uVar16 | 0x4500;
          (J->fold).ins.field_0.op1 = IVar25;
          (J->fold).ins.field_0.op2 = 0x17;
          uVar22 = lj_opt_fold(J);
          uVar23 = (ulong)pCVar14->info;
          if ((pCVar14->info & 0xf0800000) == 0x20800000) {
            uVar13 = uVar23 & 0xffff;
            uVar23 = (ulong)cts->tab[uVar13].info;
            pCVar14 = cts->tab + uVar13;
            IVar6 = crec_ct2irt(cts,pCVar14);
          }
LAB_0013332d:
          CVar7 = (CTInfo)uVar23;
          if ((CVar7 & 0xf0000000) == 0x50000000) {
            pCVar14 = cts->tab + (uVar23 & 0xffff);
            CVar7 = cts->tab[uVar23 & 0xffff].info;
          }
          if (CVar7 < 0x10000000) {
            if (IVar6 != IRT_CDATA) {
              (J->fold).ins.field_0.ot = (ushort)IVar6 | 0x4600;
              (J->fold).ins.field_0.op1 = (IRRef1)uVar22;
              (J->fold).ins.field_0.op2 = 0;
              goto LAB_0013358c;
            }
            uVar22 = 0;
          }
        }
        else if (IVar6 - IRT_I64 < 2) {
          (J->fold).ins.field_0.ot = uVar16 | 0x4500;
          (J->fold).ins.field_0.op1 = IVar25;
          (J->fold).ins.field_0.op2 = 0x19;
LAB_0013358c:
          uVar22 = lj_opt_fold(J);
        }
        else {
          if (IVar6 - IRT_INT < 2) {
            (J->fold).ins.field_0.ot = uVar16 | 0x4500;
            (J->fold).ins.field_0.op1 = IVar25;
            (J->fold).ins.field_0.op2 = 0x18;
            uVar22 = lj_opt_fold(J);
            if ((pCVar14->info & 0xf0000000) != 0x50000000) goto LAB_0013359c;
            uVar19 = pCVar14->info & 0xffff;
          }
          else {
            if (uVar22 != 6) {
              TVar8 = lj_ir_kint64(J,0x10);
              (J->fold).ins.field_0.ot = 0x2909;
              (J->fold).ins.field_0.op1 = IVar25;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
              uVar22 = lj_opt_fold(J);
              uVar23 = (ulong)pCVar14->info;
              goto LAB_0013332d;
            }
            (J->fold).ins.field_0.op1 = IVar25;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090017;
            uVar22 = lj_opt_fold(J);
            uVar19 = lj_ctype_intern(cts,uVar17 | 0x20030000,8);
          }
          pCVar14 = cts->tab + uVar19;
        }
      }
      else {
        pCVar14 = cts->tab;
        if ((uVar22 >> 0x18 & 0x1f) - 0xf < 5) {
          pCVar14 = pCVar14 + 9;
        }
        else if (uVar19 == 0xe000000) {
          pCVar14 = pCVar14 + 0xe;
        }
        else if (uVar19 == 0x4000000) {
          iVar21 = 1 - (int)lVar26;
          pGVar12 = argv2cdata(J,*(TRef *)((long)J->base + (ulong)(uint)(iVar21 * 4)),
                               (cTValue *)((ulong)(uint)(iVar21 * 8) + (long)rd->argv));
          pCVar1 = cts->tab;
          pCVar14 = pCVar1 + pGVar12->ctypeid;
          uVar19 = pCVar1[pGVar12->ctypeid].info >> 0x1c;
          if (uVar19 == 2) {
            TVar8 = lj_ir_kint64(J,0x18);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = IVar25;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
            uVar22 = lj_opt_fold(J);
          }
          else if (uVar19 == 5) {
            o = (GCobj *)(rd->argv[lVar26].u64 & 0x7fffffffffff);
            pCVar14 = lj_ctype_getfieldq(cts,pCVar14,&o->str,&ofs,(CTInfo *)0x0);
            if ((pCVar14 == (CType *)0x0) || ((pCVar14->info & 0xf0000000) != 0xb0000000))
            goto LAB_00133382;
            TVar8 = lj_ir_kgc(J,o,IRT_STR);
            (J->fold).ins.field_0.ot = 0x884;
            (J->fold).ins.field_0.op1 = IVar25;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
            lj_opt_fold(J);
            pCVar14 = cts->tab + (ushort)pCVar14->info;
            uVar22 = lj_ir_kint(J,ofs);
          }
          else {
            pCVar14 = pCVar1 + 0x11;
          }
        }
        else {
          pCVar14 = pCVar14 + 0x11;
          uVar22 = 0;
        }
      }
    }
LAB_0013359c:
    s[lVar26] = pCVar14;
    sp[lVar26] = uVar22;
  }
  uVar22 = rd->data;
  if (((uVar22 == 5) || (uVar22 == 8)) || (uVar23 = (ulong)sp[0], uVar23 == 0)) {
LAB_00133b7e:
    pTVar15 = J->base;
    if (*pTVar15 != 0) {
      if ((rd->argv->field_4).it >> 0xf == 0x1fff5) {
        pGVar12 = argv2cdata(J,*pTVar15,rd->argv);
        uVar22 = cts->tab[pGVar12->ctypeid].info;
        uVar19 = (uint)pGVar12->ctypeid;
        if ((uVar22 & 0xf0000000) == 0x20000000) {
          uVar19 = uVar22 & 0xffff;
        }
        tv = lj_ctype_meta(cts,uVar19,rd->data);
        if (tv == (cTValue *)0x0) {
          pTVar15 = J->base;
          goto LAB_00133c02;
        }
LAB_00133c75:
        if ((tv->u64 & 0xffff800000000000) == 0xfffb800000000000) {
          crec_tailcall(J,rd,tv);
          return;
        }
        goto LAB_00133d74;
      }
LAB_00133c02:
      if ((pTVar15[1] != 0) && ((rd->argv[1].u64 & 0xffff800000000000) == 0xfffa800000000000)) {
        pGVar12 = argv2cdata(J,pTVar15[1],rd->argv + 1);
        uVar22 = cts->tab[pGVar12->ctypeid].info;
        uVar19 = (uint)pGVar12->ctypeid;
        if ((uVar22 & 0xf0000000) == 0x20000000) {
          uVar19 = uVar22 & 0xffff;
        }
        tv = lj_ctype_meta(cts,uVar19,rd->data);
        if (tv != (cTValue *)0x0) goto LAB_00133c75;
      }
    }
    if (rd->data != 4) {
LAB_00133d74:
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    uVar23 = (ulong)sp[0];
    TVar9 = 0x1007ffe;
    if (((sp[0] == 0) || (uVar13 = (ulong)sp[1], sp[1] == 0)) ||
       (uVar17 = 0x889, 0xfffffff < s[1]->info == s[0]->info < 0x10000000)) goto LAB_00133d0e;
  }
  else {
    uVar13 = (ulong)sp[1];
    if (((uVar13 != 0) && (uVar19 = s[0]->info, uVar19 < 0x10000000)) &&
       (uVar20 = s[1]->info, uVar20 < 0x10000000)) {
      uVar17 = 0x16;
      iVar24 = 0xc;
      if ((((uVar19 >> 0x17 & 1) == 0) || (s[0]->size != 8)) &&
         (((uVar20 >> 0x17 & 1) == 0 || (s[1]->size != 8)))) {
        iVar24 = 0xb;
        uVar17 = 0x15;
        if (((((9 < uVar22) || (((uVar20 | uVar19) >> 0x1a & 1) != 0)) || (s[0]->size != 4)) ||
            (s[1]->size != 4)) ||
           (((((uVar20 ^ uVar19) >> 0x17 & 1) != 0 &&
             (((short)sp[1] < 0 || ((J->cur).ir[sp[1] & 0x7fff].i < 0)))) &&
            (((short)sp[0] < 0 || (uVar19 = uVar20, (J->cur).ir[sp[0] & 0x7fff].i < 0))))))
        goto LAB_00133772;
        uVar17 = ((uVar19 >> 0x17 & 1) != 0) + 0x13;
      }
      else {
LAB_00133772:
        for (lVar26 = 0; TVar8 = sp[0], lVar26 != 2; lVar26 = lVar26 + 1) {
          uVar19 = sp[lVar26];
          uVar20 = uVar19 >> 0x18 & 0x1f;
          if (uVar20 - 0xd < 2) {
            uVar16 = (short)uVar20 + uVar17 * 0x20 + 0x1000;
LAB_001337d3:
            (J->fold).ins.field_0.ot = uVar17 + 0x5b00;
            (J->fold).ins.field_0.op1 = (IRRef1)uVar19;
            (J->fold).ins.field_0.op2 = uVar16;
            TVar8 = lj_opt_fold(J);
            sp[lVar26] = TVar8;
          }
          else if (1 < uVar20 - 0x15) {
            uVar16 = ((ushort)(s[lVar26]->info >> 0xc) & 0x800 | uVar17 * 0x20) ^ 0x813;
            goto LAB_001337d3;
          }
        }
        if (9 < uVar22) {
          uVar23 = (ulong)sp[0];
          uVar13 = (ulong)sp[1];
          (J->fold).ins.field_0.ot = (short)(uVar22 << 8) + uVar17 + 0x1f00;
          (J->fold).ins.field_0.op1 = (IRRef1)sp[0];
          (J->fold).ins.field_0.op2 = (IRRef1)sp[1];
          TVar9 = lj_opt_fold(J);
          TVar10 = lj_ir_kint(J,iVar24);
          (J->fold).ins.field_0.ot = 0x548a;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
          TVar9 = lj_opt_fold(J);
          if (TVar9 != 0) goto LAB_00133d0e;
          if (TVar8 == 0) goto LAB_00133b7e;
          goto LAB_001338bc;
        }
      }
      uVar16 = 0x800;
      if (uVar22 != 4) {
        uVar4 = (ushort)(uVar22 != 6) * 0x200;
        uVar16 = uVar4 + 0x400;
        if ((uVar17 & 0xfffd) != 0x14) {
          uVar16 = uVar4;
        }
      }
      uVar17 = uVar16 | uVar17 | 0x80;
      uVar23 = (ulong)sp[0];
      uVar13 = (ulong)sp[1];
      goto LAB_00133ce9;
    }
LAB_001338bc:
    TVar8 = (TRef)uVar13;
    if (TVar8 == 0) goto LAB_00133b7e;
    cts_00 = *(CTState **)&J[-1].penalty[0x3c].val;
    uVar19 = pCVar14->info;
    TVar9 = (TRef)uVar23;
    if ((uVar19 & 0xf0000000) != 0x20000000 && (uVar19 & 0xfc000000) != 0x30000000) {
      if ((0xfffffff < uVar19 || uVar22 != 10) ||
         (uVar19 = s[1]->info, pCVar14 = s[1], TVar10 = TVar8,
         (uVar19 & 0xf0000000) != 0x20000000 && (uVar19 & 0xfc000000) != 0x30000000))
      goto LAB_00133b7e;
LAB_00133a49:
      sp[1] = TVar9;
      sp[0] = TVar10;
      uVar20 = (uint)(uVar23 >> 0x18) & 0x1f;
      CVar11 = lj_ctype_size(cts_00,uVar19 & 0xffff);
      if (uVar20 - 0xd < 2) {
        uVar17 = (ushort)uVar20 | 0x12a0;
LAB_00133ab3:
        (J->fold).ins.field_0.ot = 0x5b15;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar23;
        (J->fold).ins.field_0.op2 = uVar17;
        TVar9 = lj_opt_fold(J);
        uVar23 = (ulong)TVar9;
      }
      else if (1 < uVar20 - 0x15) {
        uVar17 = (ushort)(uVar23 >> 0xd) & 0x800 | 0x2b3;
        goto LAB_00133ab3;
      }
      TVar9 = lj_ir_kint64(J,(ulong)CVar11);
      (J->fold).ins.field_0.ot = 0x2b15;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar23;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
      TVar9 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = (short)(uVar22 << 8) + 0x1f09;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
      TVar8 = lj_opt_fold(J);
      IVar25 = (IRRef1)TVar8;
      k = lj_ctype_intern(cts_00,(ushort)pCVar14->info | 0x20030000,8);
      TVar8 = lj_ir_kint(J,k);
      IVar5 = (IRRef1)TVar8;
      IVar18 = 0x548a;
LAB_00133b59:
      (J->fold).ins.field_0.ot = IVar18;
      (J->fold).ins.field_0.op1 = IVar5;
      (J->fold).ins.field_0.op2 = IVar25;
      TVar9 = lj_opt_fold(J);
      if (TVar9 != 0) goto LAB_00133d0e;
      goto LAB_00133b7e;
    }
    if ((0xb < uVar22) ||
       (((0x8d0U >> (uVar22 & 0x1f) & 1) == 0 ||
        ((s[1]->info & 0xf0000000) != 0x20000000 && (s[1]->info & 0xfc000000) != 0x30000000)))) {
      if (((uVar22 & 0xfffffffe) == 10) &&
         (uVar23 = uVar13, TVar8 = TVar9, TVar10 = sp[0], TVar9 = sp[1], s[1]->info < 0x10000000))
      goto LAB_00133a49;
      goto LAB_00133b7e;
    }
    if (uVar22 == 4) {
      uVar17 = 0x889;
    }
    else {
      if (uVar22 == 0xb) {
        CVar11 = lj_ctype_size(cts_00,uVar19 & 0xffff);
        if (POPCOUNT(CVar11) != 1) goto LAB_00133b7e;
        (J->fold).ins.field_0.ot = 0x2a15;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar23;
        (J->fold).ins.field_0.op2 = (IRRef1)uVar13;
        TVar8 = lj_opt_fold(J);
        iVar24 = 0x1f;
        if (CVar11 != 0) {
          for (; CVar11 >> iVar24 == 0; iVar24 = iVar24 + -1) {
          }
        }
        TVar9 = lj_ir_kint(J,iVar24);
        (J->fold).ins.field_0.ot = 0x2615;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
        TVar8 = lj_opt_fold(J);
        IVar5 = (IRRef1)TVar8;
        IVar25 = 0x1d5;
        IVar18 = 0x5b0e;
        goto LAB_00133b59;
      }
      uVar17 = (ushort)(uVar22 != 6) << 9 | 0x489;
    }
  }
LAB_00133ce9:
  (J->fold).ins.field_0.ot = uVar17;
  (J->fold).ins.field_0.op1 = (IRRef1)uVar23;
  (J->fold).ins.field_0.op2 = (IRRef1)uVar13;
  J->postproc = LJ_POST_FIXGUARD;
  TVar9 = 0x2007ffd;
LAB_00133d0e:
  *J->base = TVar9;
  if (((J->postproc == LJ_POST_FIXGUARD) && (pTVar2 = J->L->base, (pTVar2[-1].u32.lo & 7) == 2)) &&
     ((-1 < (char)(J->guardemit).irt &&
      (uVar3 = pTVar2[-3].u64, (*(uint *)(uVar3 - 4) & 0xfc) < 0xc)))) {
    J[-1].penalty[0x33].pc.ptr64 = uVar3 - 4;
    J->postproc = LJ_POST_FIXCOMP;
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_cdata_arith(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef sp[2];
  CType *s[2];
  MSize i;
  for (i = 0; i < 2; i++) {
    TRef tr = J->base[i];
    CType *ct = ctype_get(cts, CTID_DOUBLE);
    if (!tr) {
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    } else if (tref_iscdata(tr)) {
      CTypeID id = argv2cdata(J, tr, &rd->argv[i])->ctypeid;
      IRType t;
      ct = ctype_raw(cts, id);
      t = crec_ct2irt(cts, ct);
      if (ctype_isptr(ct->info)) {  /* Resolve pointer or reference. */
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_PTR);
	if (ctype_isref(ct->info)) {
	  ct = ctype_rawchild(cts, ct);
	  t = crec_ct2irt(cts, ct);
	}
      } else if (t == IRT_I64 || t == IRT_U64) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT64);
	lj_needsplit(J);
	goto ok;
      } else if (t == IRT_INT || t == IRT_U32) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT);
	if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
	goto ok;
      } else if (ctype_isfunc(ct->info)) {
	tr = emitir(IRT(IR_FLOAD, IRT_PTR), tr, IRFL_CDATA_PTR);
	ct = ctype_get(cts,
	  lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|id), CTSIZE_PTR));
	goto ok;
      } else {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCcdata)));
      }
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info)) {
	if (t == IRT_CDATA) {
	  tr = 0;
	} else {
	  if (t == IRT_I64 || t == IRT_U64) lj_needsplit(J);
	  tr = emitir(IRT(IR_XLOAD, t), tr, 0);
	}
      }
    } else if (tref_isnil(tr)) {
      tr = lj_ir_kptr(J, NULL);
      ct = ctype_get(cts, CTID_P_VOID);
    } else if (tref_isinteger(tr)) {
      ct = ctype_get(cts, CTID_INT32);
    } else if (tref_isstr(tr)) {
      TRef tr2 = J->base[1-i];
      CTypeID id = argv2cdata(J, tr2, &rd->argv[1-i])->ctypeid;
      ct = ctype_raw(cts, id);
      if (ctype_isenum(ct->info)) {  /* Match string against enum constant. */
	GCstr *str = strV(&rd->argv[i]);
	CTSize ofs;
	CType *cct = lj_ctype_getfield(cts, ct, str, &ofs);
	if (cct && ctype_isconstval(cct->info)) {
	  /* Specialize to the name of the enum constant. */
	  emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, str));
	  ct = ctype_child(cts, cct);
	  tr = lj_ir_kint(J, (int32_t)ofs);
	} else {  /* Interpreter will throw or return false. */
	  ct = ctype_get(cts, CTID_P_VOID);
	}
      } else if (ctype_isptr(ct->info)) {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCstr)));
      } else {
	ct = ctype_get(cts, CTID_P_VOID);
      }
    } else if (!tref_isnum(tr)) {
      tr = 0;
      ct = ctype_get(cts, CTID_P_VOID);
    }
  ok:
    s[i] = ct;
    sp[i] = tr;
  }
  {
    TRef tr;
    MMS mm = (MMS)rd->data;
    if ((mm == MM_len || mm == MM_concat ||
	 (!(tr = crec_arith_int64(J, sp, s, mm)) &&
	  !(tr = crec_arith_ptr(J, sp, s, mm)))) &&
	!(tr = crec_arith_meta(J, sp, s, cts, rd)))
      return;
    J->base[0] = tr;
    /* Fixup cdata comparisons, too. Avoids some cdata escapes. */
    if (J->postproc == LJ_POST_FIXGUARD && frame_iscont(J->L->base-1) &&
	!irt_isguard(J->guardemit)) {
      const BCIns *pc = frame_contpc(J->L->base-1) - 1;
      if (bc_op(*pc) <= BC_ISNEP) {
	J2G(J)->tmptv.u64 = (uint64_t)(uintptr_t)pc;
	J->postproc = LJ_POST_FIXCOMP;
      }
    }
  }
}